

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BerdyHelper.cpp
# Opt level: O3

bool __thiscall
iDynTree::BerdyHelper::computeBerdySensorMatrices
          (BerdyHelper *this,SparseMatrix<(iDynTree::MatrixStorageOrdering)1> *Y,VectorDynSize *bY)

{
  Triplets *this_00;
  pointer *ppTVar1;
  void *__dest;
  iterator iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  long *plVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  JointIndex JVar11;
  SpatialAcc *pSVar12;
  ulong uVar13;
  pointer plVar14;
  ulong uVar15;
  undefined1 *puVar16;
  size_t col_1;
  long lVar17;
  ulong uVar18;
  SparseMatrix<(iDynTree::MatrixStorageOrdering)1> *Y_00;
  JointPosDoubleArray *pJVar19;
  ulong uVar20;
  Transform *pTVar21;
  size_t col;
  Traversal *pTVar22;
  IndexRange IVar23;
  IndexRange IVar24;
  Matrix1x6 SdynTree;
  SpatialMotionVector S;
  undefined1 local_208 [16];
  undefined1 auStack_1f8 [16];
  Traversal *local_1e8;
  JointPosDoubleArray *local_1e0;
  ulong local_1d8;
  SpatialAcc *local_1d0;
  VectorDynSize *local_1c8;
  SparseMatrix<(iDynTree::MatrixStorageOrdering)1> *local_1c0;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [64];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 auStack_138 [16];
  Wrench local_128 [4];
  
  local_1c0 = Y;
  iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::resize
            ((ulong)Y,this->m_nrOfSensorsMeasurements);
  Y_00 = (SparseMatrix<(iDynTree::MatrixStorageOrdering)1> *)this->m_nrOfSensorsMeasurements;
  iDynTree::VectorDynSize::resize((ulong)bY);
  this_00 = &this->matrixYElements;
  iDynTree::Triplets::clear();
  iDynTree::VectorDynSize::zero();
  if ((this->m_options).berdyVariant != BERDY_FLOATING_BASE_NON_COLLOCATED_EXT_WRENCHES) {
    computeBerdySensorsMatricesFromModel(this,Y_00,bY);
  }
  local_1c8 = bY;
  if (((this->m_options).includeAllJointAccelerationsAsSensors == true) &&
     (lVar6 = iDynTree::Model::getNrOfDOFs(), 0 < lVar6)) {
    lVar6 = 0;
    do {
      IVar23 = getRangeDOFSensorVariable(this,DOF_ACCELERATION_SENSOR,lVar6);
      IVar24 = getRangeDOFVariable(this,DOF_ACCELERATION,lVar6);
      iDynTree::Triplet::Triplet((Triplet *)local_158,IVar23.offset,IVar24.offset,1.0);
      iDynTree::Triplets::pushTriplet((Triplet *)this_00);
      lVar6 = lVar6 + 1;
      lVar7 = iDynTree::Model::getNrOfDOFs();
    } while (lVar6 < lVar7);
  }
  if ((this->m_options).includeAllJointTorquesAsSensors == true) {
    if ((this->m_options).berdyVariant == ORIGINAL_BERDY_FIXED_BASE) {
      lVar6 = iDynTree::Model::getNrOfDOFs();
      if (0 < lVar6) {
        lVar6 = 0;
        do {
          IVar23 = getRangeDOFSensorVariable(this,DOF_TORQUE_SENSOR,lVar6);
          IVar24 = getRangeDOFVariable(this,DOF_TORQUE,lVar6);
          iDynTree::Triplet::Triplet((Triplet *)local_158,IVar23.offset,IVar24.offset,1.0);
          iDynTree::Triplets::pushTriplet((Triplet *)this_00);
          lVar6 = lVar6 + 1;
          lVar7 = iDynTree::Model::getNrOfDOFs();
        } while (lVar6 < lVar7);
      }
    }
    else {
      pTVar22 = &this->m_dynamicsTraversal;
      uVar3 = iDynTree::Traversal::getNrOfVisitedLinks();
      if (1 < uVar3) {
        pJVar19 = (JointPosDoubleArray *)0x1;
        local_1e8 = pTVar22;
        do {
          iDynTree::Traversal::getLink((long)pTVar22);
          iDynTree::Traversal::getParentLink((long)pTVar22);
          local_1e0 = pJVar19;
          plVar8 = (long *)iDynTree::Traversal::getParentJoint((long)pTVar22);
          uVar9 = iDynTree::Link::getIndex();
          uVar10 = iDynTree::Link::getIndex();
          uVar3 = (**(code **)(*plVar8 + 0x20))(plVar8);
          lVar6 = (**(code **)(*plVar8 + 0xc0))(plVar8);
          if (uVar3 != 0) {
            uVar20 = 0;
            local_1d8 = (ulong)uVar3;
            do {
              (**(code **)(*plVar8 + 0x60))(local_158,plVar8,uVar20 & 0xffffffff,uVar9,uVar10);
              local_208._0_8_ = local_148._0_8_;
              local_208._8_8_ = local_148._8_8_;
              auStack_1f8._0_8_ = auStack_138._0_8_;
              auStack_1f8._8_8_ = auStack_138._8_8_;
              local_1b8._0_8_ = local_158._0_8_;
              local_1b8._8_8_ = local_158._8_8_;
              local_1a8._0_8_ = local_148._0_8_;
              local_1a8._8_8_ = local_148._8_8_;
              local_198._0_8_ = auStack_138._0_8_;
              local_198._8_8_ = auStack_138._8_8_;
              IVar23 = getRangeDOFSensorVariable(this,DOF_TORQUE_SENSOR,lVar6 + uVar20);
              JVar11 = (**(code **)(*plVar8 + 0xa0))(plVar8);
              IVar24 = getRangeJointVariable(this,JOINT_WRENCH,JVar11);
              std::vector<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>::reserve
                        (&this_00->m_triplets,
                         ((long)(this->matrixYElements).m_triplets.
                                super__Vector_base<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->matrixYElements).m_triplets.
                                super__Vector_base<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3) *
                         -0x5555555555555555 + 6);
              lVar7 = 0;
              do {
                iDynTree::Triplet::Triplet
                          ((Triplet *)local_208,IVar23.offset,IVar24.offset + lVar7,
                           *(double *)(local_1b8 + lVar7 * 8));
                iVar2._M_current =
                     (this->matrixYElements).m_triplets.
                     super__Vector_base<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
                if (iVar2._M_current ==
                    (this->matrixYElements).m_triplets.
                    super__Vector_base<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>::
                  _M_realloc_insert<iDynTree::Triplet>
                            (&this_00->m_triplets,iVar2,(Triplet *)local_208);
                }
                else {
                  *(undefined8 *)(iVar2._M_current + 0x10) = auStack_1f8._0_8_;
                  *(undefined8 *)iVar2._M_current = local_208._0_8_;
                  *(undefined8 *)(iVar2._M_current + 8) = local_208._8_8_;
                  ppTVar1 = &(this->matrixYElements).m_triplets.
                             super__Vector_base<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                  *ppTVar1 = *ppTVar1 + 0x18;
                }
                lVar7 = lVar7 + 1;
              } while (lVar7 != 6);
              uVar20 = uVar20 + 1;
            } while (uVar20 != local_1d8);
          }
          pTVar22 = local_1e8;
          pJVar19 = local_1e0 + 1;
          uVar3 = iDynTree::Traversal::getNrOfVisitedLinks();
        } while (pJVar19 < (undefined1 *)(ulong)uVar3);
      }
    }
  }
  if (((this->m_options).includeAllNetExternalWrenchesAsSensors == true) &&
     (lVar6 = iDynTree::Model::getNrOfLinks(), 0 < lVar6)) {
    local_1e8 = &this->m_dynamicsTraversal;
    local_1e0 = &this->m_jointPos;
    local_1d0 = &this->m_gravity6D;
    lVar6 = 0;
    do {
      if ((this->m_options).berdyVariant == ORIGINAL_BERDY_FIXED_BASE) {
        iDynTree::Traversal::getBaseLink();
        lVar7 = iDynTree::Link::getIndex();
        if (lVar7 != lVar6) goto LAB_001359b2;
        if ((this->m_options).includeFixedBaseExternalWrench == true) {
          iVar4 = iDynTree::Model::getNrOfNeighbors((long)this);
          if (iVar4 != 0) {
            uVar3 = 0;
            local_1d8 = lVar6 * 0x60;
            do {
              iDynTree::Model::getNeighbor((long)this,(uint)lVar6);
              iDynTree::Model::getNeighbor((long)this,(uint)lVar6);
              plVar8 = (long *)iDynTree::Model::getJoint((long)this);
              (**(code **)(*plVar8 + 0x50))(plVar8,local_1e0,lVar6);
              pTVar21 = (Transform *)local_158;
              iDynTree::Transform::inverse();
              iDynTree::Transform::operator*((Transform *)local_1b8,pTVar21);
              IVar23 = getRangeLinkSensorVariable(this,NET_EXT_WRENCH_SENSOR,lVar6);
              JVar11 = (**(code **)(*plVar8 + 0xa0))(plVar8);
              IVar24 = getRangeJointVariable(this,JOINT_WRENCH,JVar11);
              iDynTree::Transform::asAdjointTransformWrench();
              std::vector<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>::reserve
                        (&this_00->m_triplets,
                         ((long)(this->matrixYElements).m_triplets.
                                super__Vector_base<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->matrixYElements).m_triplets.
                                super__Vector_base<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3) *
                         -0x5555555555555555 + 0x24);
              lVar7 = 0;
              do {
                lVar17 = 0;
                do {
                  iDynTree::Triplet::Triplet
                            ((Triplet *)local_208,lVar7 + IVar23.offset,IVar24.offset + lVar17,
                             *(double *)(pTVar21 + lVar17 * 8));
                  iVar2._M_current =
                       (this->matrixYElements).m_triplets.
                       super__Vector_base<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
                  if (iVar2._M_current ==
                      (this->matrixYElements).m_triplets.
                      super__Vector_base<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>::
                    _M_realloc_insert<iDynTree::Triplet>
                              (&this_00->m_triplets,iVar2,(Triplet *)local_208);
                  }
                  else {
                    *(undefined8 *)(iVar2._M_current + 0x10) = auStack_1f8._0_8_;
                    *(undefined8 *)iVar2._M_current = local_208._0_8_;
                    *(undefined8 *)(iVar2._M_current + 8) = local_208._8_8_;
                    ppTVar1 = &(this->matrixYElements).m_triplets.
                               super__Vector_base<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                    *ppTVar1 = *ppTVar1 + 0x18;
                  }
                  lVar17 = lVar17 + 1;
                } while (lVar17 != 6);
                lVar7 = lVar7 + 1;
                pTVar21 = pTVar21 + 0x30;
              } while (lVar7 != 6);
              uVar3 = uVar3 + 1;
              uVar5 = iDynTree::Model::getNrOfNeighbors((long)this);
            } while (uVar3 < uVar5);
          }
          iDynTree::Model::getLink((long)this);
          pSVar12 = (SpatialAcc *)iDynTree::Link::getInertia();
          iDynTree::SpatialInertia::operator*((SpatialInertia *)local_1b8,pSVar12);
          iDynTree::Wrench::operator-((Wrench *)local_158);
          iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)local_1b8);
          IVar23 = getRangeLinkSensorVariable(this,NET_EXT_WRENCH_SENSOR,lVar6);
          lVar7 = IVar23.offset;
          local_1b8._0_8_ = local_158._8_8_;
          local_1b8._8_8_ = local_148._0_8_;
          local_1a8._0_8_ = local_148._8_8_;
          local_1a8._8_8_ = auStack_138._0_8_;
          local_198._0_8_ = auStack_138._8_8_;
          local_198._8_8_ = local_128[0]._0_8_;
          lVar17 = iDynTree::VectorDynSize::data();
          iDynTree::VectorDynSize::size();
          __dest = (void *)(lVar17 + lVar7 * 8);
          uVar15 = (ulong)((uint)((ulong)__dest >> 3) & 1);
          uVar20 = 6;
          if (((ulong)__dest & 7) == 0) {
            uVar20 = uVar15;
          }
          iVar4 = (int)uVar20;
          if (uVar20 != 0) {
            memcpy(__dest,(SpatialInertia *)local_1b8,(ulong)(uint)(iVar4 * 8));
          }
          uVar3 = 6 - iVar4;
          uVar18 = (uVar3 & 0xfffffffe) + uVar20;
          if (((ulong)__dest & 7) == 0) {
            uVar13 = uVar15 + 2;
            if (uVar15 + 2 < uVar18) {
              uVar13 = uVar18;
            }
            memcpy((void *)(lVar17 + (uVar15 + lVar7) * 8),local_1b8 + uVar15 * 8,
                   (~uVar15 + uVar13 & 0xffffffffffffffe) * 8 + 0x10);
          }
          if ((uint)uVar18 < 6) {
            memcpy((void *)(lVar17 + (lVar7 + uVar20 + (ulong)(uVar3 & 0xfffffffe)) * 8),
                   local_1b8 + (ulong)((uVar3 & 0xfffffffe) + iVar4) * 8,(ulong)((uVar3 & 1) << 3));
          }
          iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)local_158);
        }
      }
      else {
LAB_001359b2:
        IVar23 = getRangeLinkSensorVariable(this,NET_EXT_WRENCH_SENSOR,lVar6);
        IVar24 = getRangeLinkVariable(this,NET_EXT_WRENCH,lVar6);
        iDynTree::Transform::inverse();
        puVar16 = local_158;
        iDynTree::Transform::asAdjointTransformWrench();
        std::vector<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>::reserve
                  (&this_00->m_triplets,
                   ((long)(this->matrixYElements).m_triplets.
                          super__Vector_base<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->matrixYElements).m_triplets.
                          super__Vector_base<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 +
                   0x24);
        lVar7 = 0;
        do {
          lVar17 = 0;
          do {
            iDynTree::Triplet::Triplet
                      ((Triplet *)local_208,lVar7 + IVar23.offset,IVar24.offset + lVar17,
                       *(double *)(puVar16 + lVar17 * 8));
            iVar2._M_current =
                 (this->matrixYElements).m_triplets.
                 super__Vector_base<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar2._M_current ==
                (this->matrixYElements).m_triplets.
                super__Vector_base<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>::
              _M_realloc_insert<iDynTree::Triplet>(&this_00->m_triplets,iVar2,(Triplet *)local_208);
            }
            else {
              *(undefined8 *)(iVar2._M_current + 0x10) = auStack_1f8._0_8_;
              *(undefined8 *)iVar2._M_current = local_208._0_8_;
              *(undefined8 *)(iVar2._M_current + 8) = local_208._8_8_;
              ppTVar1 = &(this->matrixYElements).m_triplets.
                         super__Vector_base<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
              *ppTVar1 = *ppTVar1 + 0x18;
            }
            lVar17 = lVar17 + 1;
          } while (lVar17 != 6);
          lVar7 = lVar7 + 1;
          puVar16 = puVar16 + 0x30;
        } while (lVar7 != 6);
      }
      lVar6 = lVar6 + 1;
      lVar7 = iDynTree::Model::getNrOfLinks();
    } while (lVar6 < lVar7);
  }
  plVar14 = (this->berdySensorsInfo).wrenchSensors.super__Vector_base<long,_std::allocator<long>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->berdySensorsInfo).wrenchSensors.super__Vector_base<long,_std::allocator<long>_>._M_impl
      .super__Vector_impl_data._M_finish != plVar14) {
    uVar20 = 0;
    do {
      lVar6 = plVar14[uVar20];
      iDynTree::IndexRange::InvalidRange();
      uVar15 = (this->berdySensorsInfo).jntIdxToOffset.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[lVar6];
      IVar23 = getRangeJointVariable
                         (this,JOINT_WRENCH,
                          (this->berdySensorsInfo).wrenchSensors.
                          super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar20]);
      iDynTree::Triplets::addDiagonalMatrix((ulong)this_00,uVar15,1.0,IVar23.offset);
      uVar20 = uVar20 + 1;
      plVar14 = (this->berdySensorsInfo).wrenchSensors.
                super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                _M_start;
    } while (uVar20 < (ulong)((long)(this->berdySensorsInfo).wrenchSensors.
                                    super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                    super__Vector_impl_data._M_finish - (long)plVar14 >> 3));
  }
  if ((this->m_options).berdyVariant == BERDY_FLOATING_BASE_NON_COLLOCATED_EXT_WRENCHES) {
    IVar23 = getRangeRCMSensorVariable(this,RCM_SENSOR);
    lVar6 = iDynTree::Model::getNrOfLinks();
    if (lVar6 != 0) {
      uVar20 = 0;
      do {
        IVar24 = getRangeLinkVariable(this,NET_EXT_WRENCH,uVar20);
        pTVar21 = (Transform *)iDynTree::LinkPositions::operator()(&this->base_H_links,uVar20);
        iDynTree::Transform::Transform((Transform *)local_1b8,pTVar21);
        puVar16 = local_158;
        iDynTree::Transform::asAdjointTransformWrench();
        std::vector<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>::reserve
                  (&this_00->m_triplets,
                   ((long)(this->matrixYElements).m_triplets.
                          super__Vector_base<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->matrixYElements).m_triplets.
                          super__Vector_base<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 +
                   0x24);
        lVar6 = 0;
        do {
          lVar7 = 0;
          do {
            iDynTree::Triplet::Triplet
                      ((Triplet *)local_208,lVar6 + IVar23.offset,IVar24.offset + lVar7,
                       *(double *)(puVar16 + lVar7 * 8));
            iVar2._M_current =
                 (this->matrixYElements).m_triplets.
                 super__Vector_base<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar2._M_current ==
                (this->matrixYElements).m_triplets.
                super__Vector_base<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>::
              _M_realloc_insert<iDynTree::Triplet>(&this_00->m_triplets,iVar2,(Triplet *)local_208);
            }
            else {
              *(undefined8 *)(iVar2._M_current + 0x10) = auStack_1f8._0_8_;
              *(undefined8 *)iVar2._M_current = local_208._0_8_;
              *(undefined8 *)(iVar2._M_current + 8) = local_208._8_8_;
              ppTVar1 = &(this->matrixYElements).m_triplets.
                         super__Vector_base<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
              *ppTVar1 = *ppTVar1 + 0x18;
            }
            lVar7 = lVar7 + 1;
          } while (lVar7 != 6);
          lVar6 = lVar6 + 1;
          puVar16 = puVar16 + 0x30;
        } while (lVar6 != 6);
        uVar20 = uVar20 + 1;
        uVar15 = iDynTree::Model::getNrOfLinks();
      } while (uVar20 < uVar15);
    }
  }
  iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::setFromTriplets((Triplets *)local_1c0)
  ;
  return true;
}

Assistant:

bool BerdyHelper::computeBerdySensorMatrices(SparseMatrix<iDynTree::ColumnMajor>& Y, VectorDynSize& bY)
{
    Y.resize(m_nrOfSensorsMeasurements,m_nrOfDynamicalVariables);
    bY.resize(m_nrOfSensorsMeasurements);
    // \todo TODO check if this is a bottleneck
//    Y.zero();
    matrixYElements.clear();
    bY.zero();

    // For now handle all sensor types explicitly TODO clean this up
    
    if(m_options.berdyVariant!=BERDY_FLOATING_BASE_NON_COLLOCATED_EXT_WRENCHES)
    {
        if(!computeBerdySensorsMatricesFromModel(Y, bY))
        {
            return false;
        }
    }
    
    ////////////////////////////////////////////////////////////////////////
    ///// JOINT ACCELERATIONS
    ////////////////////////////////////////////////////////////////////////
    if( m_options.includeAllJointAccelerationsAsSensors )
    {
        for(DOFIndex idx = 0; idx< static_cast<DOFIndex>(m_model.getNrOfDOFs()); idx++)
        {
            // Y for the joint accelerations is just a rows of 0s and one 1  corresponding to the location
            // of the relative joint acceleration in the dynamic variables vector
            IndexRange sensorRange = this->getRangeDOFSensorVariable(DOF_ACCELERATION_SENSOR,idx);
            IndexRange jointAccRange = this->getRangeDOFVariable(DOF_ACCELERATION,idx);

            matrixYElements.pushTriplet(Triplet(sensorRange.offset, jointAccRange.offset, 1));

            // bY for the joint acceleration is zero
        }
    }

    ////////////////////////////////////////////////////////////////////////
    ///// JOINT TORQUES
    ////////////////////////////////////////////////////////////////////////
    if( m_options.includeAllJointTorquesAsSensors )
    {
        if (m_options.berdyVariant == ORIGINAL_BERDY_FIXED_BASE)
        {
          for(DOFIndex idx = 0; idx < static_cast<DOFIndex>(m_model.getNrOfDOFs()); idx++)
          {
              // Y for the joint torques is just a rows of 0s and one 1  corresponding to the location
            // of the relative joint torques in the dynamic variables vector
            IndexRange sensorRange = this->getRangeDOFSensorVariable(DOF_TORQUE_SENSOR,idx);
            IndexRange jointTrqRange = this->getRangeDOFVariable(DOF_TORQUE,idx);

            matrixYElements.pushTriplet(Triplet(sensorRange.offset, jointTrqRange.offset, 1));

            // bY for the joint torques is zero
          }
        }
        else 
        {
            assert(m_options.berdyVariant == BERDY_FLOATING_BASE);
            // We have to map the joint wrench to the joint torques, since joint wrench is considered as dynamic variable
            for (TraversalIndex traversalEl = 1;
                traversalEl < static_cast<TraversalIndex>(m_dynamicsTraversal.getNrOfVisitedLinks());
                traversalEl++)
            {
                LinkConstPtr visitedLink = m_dynamicsTraversal.getLink(traversalEl);
                LinkConstPtr parentLink = m_dynamicsTraversal.getParentLink(traversalEl);
                IJointConstPtr toParentJoint = m_dynamicsTraversal.getParentJoint(traversalEl);
                LinkIndex visitedLinkIdx = visitedLink->getIndex();
                LinkIndex parentLinkIdx = parentLink->getIndex();
            
                size_t jointDOFs = toParentJoint->getNrOfDOFs();
                size_t dofOffset = toParentJoint->getDOFsOffset();
            
                for (size_t localDof = 0; localDof < jointDOFs; localDof++)
                {
                    SpatialMotionVector S = toParentJoint->getMotionSubspaceVector(localDof, visitedLinkIdx, parentLinkIdx);
                    Matrix1x6 SdynTree;
                    toEigen(SdynTree) = toEigen(S).transpose();
              
                    matrixYElements.addSubMatrix(getRangeDOFSensorVariable(DOF_TORQUE_SENSOR, dofOffset + localDof).offset,
                                                 getRangeJointVariable(JOINT_WRENCH, toParentJoint->getIndex()).offset,
                                                 SdynTree);
                }
            }
        }
    }

    ////////////////////////////////////////////////////////////////////////
    ///// NET EXTERNAL WRENCHES ACTING ON LINKS
    ////////////////////////////////////////////////////////////////////////
    if( m_options.includeAllNetExternalWrenchesAsSensors )
    {
        for(LinkIndex idx = 0; idx < static_cast<LinkIndex>(m_model.getNrOfLinks()); idx++)
        {
            // If this link is the (fixed) base link and the
            // berdy variant is ORIGINAL_BERDY_FIXED_BASE , then
            // the net wrench applied on the base is not part of the dynamical
            // system. Anyhow, we can still write the base wrench as a function
            // of sum of the joint wrenches of all the joints attached to the base (tipically just one)
            if( m_options.berdyVariant == ORIGINAL_BERDY_FIXED_BASE &&
                m_dynamicsTraversal.getBaseLink()->getIndex() == idx )
            {
                if(  m_options.includeFixedBaseExternalWrench  )
                {
                    // Y encodes the (time varyng) relation between the wrenches transmitted by the joint attached
                    // to the base and net external wrench applied on the robot
                    // \todo TODO this "get child" for is duplicated in the code, we
                    // should try to consolidate it
                    for(unsigned int neigh_i=0; neigh_i < m_model.getNrOfNeighbors(idx); neigh_i++)
                    {
                        LinkIndex neighborIndex = m_model.getNeighbor(idx,neigh_i).neighborLink;
                        LinkIndex childIndex = neighborIndex;
                        IJointConstPtr neighborJoint = m_model.getJoint(m_model.getNeighbor(idx,neigh_i).neighborJoint);
                        const Transform & base_X_child = neighborJoint->getTransform(m_jointPos,idx,childIndex);
                        Transform measurementFrame_X_child = m_link_H_externalWrenchMeasurementFrame[idx].inverse()*base_X_child;

                        matrixYElements.addSubMatrix(getRangeLinkSensorVariable(NET_EXT_WRENCH_SENSOR,idx).offset,
                                                     getRangeJointVariable(JOINT_WRENCH,neighborJoint->getIndex()).offset, measurementFrame_X_child.asAdjointTransformWrench());
                    }

                    // bY encodes the weight of the base link due to gravity (we omit the v*I*v as it is always zero)
                    Wrench baseLinkNetTotalWrenchesWithoutGrav = -(m_model.getLink(idx)->getInertia()*m_gravity6D);
                    setSubVector(bY,getRangeLinkSensorVariable(NET_EXT_WRENCH_SENSOR,idx),toEigen(baseLinkNetTotalWrenchesWithoutGrav));
                }
            }
            else
            {
                // Y for the net external wrenches is just
                // six rows of 0 with an identity placed at the location
                // of the net external wrenches in the dynamic variable vector
                IndexRange sensorRange = this->getRangeLinkSensorVariable(NET_EXT_WRENCH_SENSOR,idx);
                IndexRange netExtWrenchRange = this->getRangeLinkVariable(NET_EXT_WRENCH,idx);

                Transform measurementFrame_X_link = m_link_H_externalWrenchMeasurementFrame[idx].inverse();

                matrixYElements.addSubMatrix(sensorRange.offset,
                                             netExtWrenchRange.offset,
                                             measurementFrame_X_link.asAdjointTransformWrench());

                // bY for the net external wrenches is zero
            }
        }
    }

    ////////////////////////////////////////////////////////////////////////
    ///// JOINT WRENCHES
    ////////////////////////////////////////////////////////////////////////
    for(size_t i = 0; i < this->berdySensorsInfo.wrenchSensors.size(); i++)
    {
        // Y for the joint wrenches is just
        // six rows of 0 with an identity placed at the location
        // of the joint wrenches in the dynamic variable vector
        IndexRange sensorRange = this->getRangeJointSensorVariable(JOINT_WRENCH_SENSOR,berdySensorsInfo.wrenchSensors[i]);
        IndexRange jointWrenchOffset = this->getRangeJointVariable(JOINT_WRENCH,berdySensorsInfo.wrenchSensors[i]);

        assert(sensorRange.size == 6);
        assert(jointWrenchOffset.size == 6);
        matrixYElements.addDiagonalMatrix(sensorRange,
                                          jointWrenchOffset,
                                          1);

        // bY for the joint wrenches is zero
    }

    ////////////////////////////////////////////////////////////////////////
    ///// Rate of Change of Momentum (RCM) SENSOR
    ////////////////////////////////////////////////////////////////////////
    if (m_options.berdyVariant==BERDY_FLOATING_BASE_NON_COLLOCATED_EXT_WRENCHES)
    {
        // Get the row index corresponding to the RCM sensor
        IndexRange rcmRange = this->getRangeRCMSensorVariable(RCM_SENSOR);

        for(LinkIndex idx = 0 ; idx < m_model.getNrOfLinks(); idx++)
        {
            // Get the column index corresponding to the net link external wrench sensor
            IndexRange netExternalWrenchVariableIndexRange = this->getRangeLinkVariable(NET_EXT_WRENCH, idx);

            // Get base to link transform
            Transform base_X_link = base_H_links(idx);

            // Get link to base rotation
            matrixYElements.addSubMatrix(rcmRange.offset,
                                         netExternalWrenchVariableIndexRange.offset,
                                         base_X_link.asAdjointTransformWrench());
        }

        // bY for the RCM sensor is zero
    }

    Y.setFromTriplets(matrixYElements);
    return true;
}